

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsDirectDemo_ls.c
# Opt level: O2

int PrepareNextRun(SUNContext sunctx,void *cvode_mem,int lmm,int miter,N_Vector y,SUNMatrix *A,
                  sunindextype mu,sunindextype ml,SUNLinearSolver *LS,SUNNonlinearSolver *NLS)

{
  int iVar1;
  int iVar2;
  SUNLinearSolver p_Var3;
  SUNMatrix p_Var4;
  void *pvVar5;
  code *pcVar6;
  char *pcVar7;
  int local_3c;
  N_Vector local_38;
  
  local_38 = y;
  if (*LS != (SUNLinearSolver)0x0) {
    SUNNonlinSolFree();
  }
  if (*(long *)ml != 0) {
    SUNLinSolFree();
  }
  if (*A != (SUNMatrix)0x0) {
    SUNMatDestroy();
  }
  printf("\n\n-------------------------------------------------------------");
  printf("\n\nLinear Multistep Method : ");
  pcVar7 = "BDF";
  if (lmm == 1) {
    pcVar7 = "ADAMS";
  }
  puts(pcVar7);
  printf("Iteration               : ");
  if (miter == 0) {
    puts("FIXEDPOINT");
    p_Var3 = (SUNLinearSolver)SUNNonlinSol_FixedPoint(local_38,0,sunctx);
    *LS = p_Var3;
    iVar1 = check_retval(p_Var3,"SUNNonlinSol_FixedPoint",0);
    if (iVar1 != 0) {
      return 1;
    }
    local_3c = CVodeSetNonlinearSolver(cvode_mem,*LS);
    pcVar7 = "CVodeSetNonlinearSolver";
    goto LAB_001034f2;
  }
  puts("NEWTON");
  p_Var3 = (SUNLinearSolver)SUNNonlinSol_Newton(local_38,sunctx);
  *LS = p_Var3;
  local_3c = CVodeSetNonlinearSolver(cvode_mem,p_Var3);
  iVar1 = check_retval(&local_3c,"CVodeSetNonlinearSolver",1);
  if (iVar1 != 0) {
    return 1;
  }
  printf("Linear Solver           : ");
  switch(miter) {
  case 1:
    puts("Dense, User-Supplied Jacobian");
    p_Var4 = (SUNMatrix)SUNDenseMatrix(2,2,sunctx);
    *A = p_Var4;
    iVar1 = check_retval(p_Var4,"SUNDenseMatrix",0);
    if (iVar1 != 0) {
      return 1;
    }
    pvVar5 = (void *)SUNLinSol_Dense(local_38,*A,sunctx);
    *(void **)ml = pvVar5;
    iVar1 = check_retval(pvVar5,"SUNLinSol_Dense",0);
    if (iVar1 != 0) {
      return 1;
    }
    local_3c = CVodeSetLinearSolver(cvode_mem,*(undefined8 *)ml,*A);
    iVar1 = check_retval(&local_3c,"CVodeSetLinearSolver",1);
    if (iVar1 != 0) {
      return 1;
    }
    pcVar6 = Jac1;
    break;
  case 2:
    puts("Dense, Difference Quotient Jacobian");
    p_Var4 = (SUNMatrix)SUNDenseMatrix(2,2,sunctx);
    *A = p_Var4;
    iVar1 = check_retval(p_Var4,"SUNDenseMatrix",0);
    if (iVar1 != 0) {
      return 1;
    }
    pvVar5 = (void *)SUNLinSol_Dense(local_38,*A,sunctx);
    *(void **)ml = pvVar5;
    pcVar7 = "SUNLinSol_Dense";
    goto LAB_00103612;
  case 3:
    puts("Diagonal Jacobian");
    local_3c = CVDiag(cvode_mem);
    pcVar7 = "CVDiag";
    goto LAB_001034f2;
  case 4:
    puts("Band, User-Supplied Jacobian");
    p_Var4 = (SUNMatrix)SUNBandMatrix(0x19,0,mu,sunctx);
    *A = p_Var4;
    iVar1 = check_retval(p_Var4,"SUNBandMatrix",0);
    if (iVar1 != 0) {
      return 1;
    }
    pvVar5 = (void *)SUNLinSol_Band(local_38,*A,sunctx);
    *(void **)ml = pvVar5;
    iVar1 = check_retval(pvVar5,"SUNLinSol_Band",0);
    if (iVar1 != 0) {
      return 1;
    }
    local_3c = CVodeSetLinearSolver(cvode_mem,*(undefined8 *)ml,*A);
    iVar1 = check_retval(&local_3c,"CVodeSetLinearSolver",1);
    if (iVar1 != 0) {
      return 1;
    }
    pcVar6 = Jac2;
    break;
  case 5:
    puts("Band, Difference Quotient Jacobian");
    p_Var4 = (SUNMatrix)SUNBandMatrix(0x19,0,mu,sunctx);
    *A = p_Var4;
    iVar1 = check_retval(p_Var4,"SUNBandMatrix",0);
    if (iVar1 != 0) {
      return 1;
    }
    pvVar5 = (void *)SUNLinSol_Band(local_38,*A,sunctx);
    *(void **)ml = pvVar5;
    pcVar7 = "SUNLinSol_Band";
LAB_00103612:
    iVar1 = check_retval(pvVar5,pcVar7,0);
    if (iVar1 != 0) {
      return 1;
    }
    local_3c = CVodeSetLinearSolver(cvode_mem,*(undefined8 *)ml,*A);
    iVar1 = check_retval(&local_3c,"CVodeSetLinearSolver",1);
    if (iVar1 != 0) {
      return 1;
    }
    pcVar6 = (code *)0x0;
    break;
  default:
    goto switchD_00103375_default;
  }
  local_3c = CVodeSetJacFn(cvode_mem,pcVar6);
  pcVar7 = "CVodeSetJacFn";
LAB_001034f2:
  iVar1 = 1;
  iVar2 = check_retval(&local_3c,pcVar7,1);
  if (iVar2 == 0) {
switchD_00103375_default:
    iVar1 = local_3c;
  }
  return iVar1;
}

Assistant:

static int PrepareNextRun(SUNContext sunctx, void* cvode_mem, int lmm,
                          int miter, N_Vector y, SUNMatrix* A, sunindextype mu,
                          sunindextype ml, SUNLinearSolver* LS,
                          SUNNonlinearSolver* NLS)
{
  int retval = CV_SUCCESS;

  if (*NLS) { SUNNonlinSolFree(*NLS); }
  if (*LS) { SUNLinSolFree(*LS); }
  if (*A) { SUNMatDestroy(*A); }

  printf("\n\n-------------------------------------------------------------");

  printf("\n\nLinear Multistep Method : ");
  if (lmm == CV_ADAMS) { printf("ADAMS\n"); }
  else { printf("BDF\n"); }

  printf("Iteration               : ");
  if (miter == FUNC)
  {
    printf("FIXEDPOINT\n");

    /* create fixed point nonlinear solver object */
    *NLS = SUNNonlinSol_FixedPoint(y, 0, sunctx);
    if (check_retval((void*)*NLS, "SUNNonlinSol_FixedPoint", 0)) { return (1); }

    /* attach nonlinear solver object to CVode */
    retval = CVodeSetNonlinearSolver(cvode_mem, *NLS);
    if (check_retval(&retval, "CVodeSetNonlinearSolver", 1)) { return (1); }
  }
  else
  {
    printf("NEWTON\n");

    /* create Newton nonlinear solver object */
    *NLS = SUNNonlinSol_Newton(y, sunctx);
    if (check_retval((void*)NLS, "SUNNonlinSol_Newton", 0)) { return (1); }

    /* attach nonlinear solver object to CVode */
    retval = CVodeSetNonlinearSolver(cvode_mem, *NLS);
    if (check_retval(&retval, "CVodeSetNonlinearSolver", 1)) { return (1); }

    printf("Linear Solver           : ");

    switch (miter)
    {
    case DENSE_USER:
      printf("Dense, User-Supplied Jacobian\n");

      /* Create dense SUNMatrix for use in linear solves */
      *A = SUNDenseMatrix(P1_NEQ, P1_NEQ, sunctx);
      if (check_retval((void*)*A, "SUNDenseMatrix", 0)) { return (1); }

      /* Create dense SUNLinearSolver object for use by CVode */
      *LS = SUNLinSol_Dense(y, *A, sunctx);
      if (check_retval((void*)*LS, "SUNLinSol_Dense", 0)) { return (1); }

      /* Call CVodeSetLinearSolver to attach the matrix and linear solver to CVode */
      retval = CVodeSetLinearSolver(cvode_mem, *LS, *A);
      if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return (1); }

      /* Set the user-supplied Jacobian routine Jac */
      retval = CVodeSetJacFn(cvode_mem, Jac1);
      if (check_retval(&retval, "CVodeSetJacFn", 1)) { return (1); }
      break;

    case DENSE_DQ:
      printf("Dense, Difference Quotient Jacobian\n");

      /* Create dense SUNMatrix for use in linear solves */
      *A = SUNDenseMatrix(P1_NEQ, P1_NEQ, sunctx);
      if (check_retval((void*)*A, "SUNDenseMatrix", 0)) { return (1); }

      /* Create dense SUNLinearSolver object for use by CVode */
      *LS = SUNLinSol_Dense(y, *A, sunctx);
      if (check_retval((void*)*LS, "SUNLinSol_Dense", 0)) { return (1); }

      /* Call CVodeSetLinearSolver to attach the matrix and linear solver to CVode */
      retval = CVodeSetLinearSolver(cvode_mem, *LS, *A);
      if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return (1); }

      /* Use a difference quotient Jacobian */
      retval = CVodeSetJacFn(cvode_mem, NULL);
      if (check_retval(&retval, "CVodeSetJacFn", 1)) { return (1); }
      break;

    case DIAG:
      printf("Diagonal Jacobian\n");

      /* Call CVDiag to create/attach the CVODE-specific diagonal solver */
      retval = CVDiag(cvode_mem);
      if (check_retval(&retval, "CVDiag", 1)) { return (1); }
      break;

    case BAND_USER:
      printf("Band, User-Supplied Jacobian\n");

      /* Create band SUNMatrix for use in linear solves */
      *A = SUNBandMatrix(P2_NEQ, mu, ml, sunctx);
      if (check_retval((void*)*A, "SUNBandMatrix", 0)) { return (1); }

      /* Create banded SUNLinearSolver object for use by CVode */
      *LS = SUNLinSol_Band(y, *A, sunctx);
      if (check_retval((void*)*LS, "SUNLinSol_Band", 0)) { return (1); }

      /* Call CVodeSetLinearSolver to attach the matrix and linear solver to CVode */
      retval = CVodeSetLinearSolver(cvode_mem, *LS, *A);
      if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return (1); }

      /* Set the user-supplied Jacobian routine Jac */
      retval = CVodeSetJacFn(cvode_mem, Jac2);
      if (check_retval(&retval, "CVodeSetJacFn", 1)) { return (1); }
      break;

    case BAND_DQ:
      printf("Band, Difference Quotient Jacobian\n");

      /* Create band SUNMatrix for use in linear solves */
      *A = SUNBandMatrix(P2_NEQ, mu, ml, sunctx);
      if (check_retval((void*)*A, "SUNBandMatrix", 0)) { return (1); }

      /* Create banded SUNLinearSolver object for use by CVode */
      *LS = SUNLinSol_Band(y, *A, sunctx);
      if (check_retval((void*)*LS, "SUNLinSol_Band", 0)) { return (1); }

      /* Call CVodeSetLinearSolver to attach the matrix and linear solver to CVode */
      retval = CVodeSetLinearSolver(cvode_mem, *LS, *A);
      if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return (1); }

      /* Use a difference quotient Jacobian */
      retval = CVodeSetJacFn(cvode_mem, NULL);
      if (check_retval(&retval, "CVodeSetJacFn", 1)) { return (1); }
      break;
    }
  }

  return (retval);
}